

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O1

uint8_t visuals_cycler_get_attr_for_frame(char *group_name,char *cycle_name,size_t frame)

{
  uint8_t uVar1;
  visuals_color_cycle *pvVar2;
  
  pvVar2 = visuals_cycler_cycle_by_name(visuals_cycler_table,group_name,cycle_name);
  if (pvVar2 == (visuals_color_cycle *)0x0) {
    uVar1 = '\x1d';
  }
  else {
    uVar1 = pvVar2->steps[frame % pvVar2->max_steps];
  }
  return uVar1;
}

Assistant:

uint8_t visuals_cycler_get_attr_for_frame(const char *group_name,
									   const char *cycle_name,
									   size_t const frame)
{
	struct visuals_cycler *table = visuals_cycler_table;
	struct visuals_color_cycle *cycle = NULL;
	cycle = visuals_cycler_cycle_by_name(table, group_name, cycle_name);

	if (cycle == NULL) {
		return BASIC_COLORS;
	}

	return visuals_color_cycle_attr_for_frame(cycle, frame);
}